

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_TreeEnsemble_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00725a38 == '\x01') {
    DAT_00725a38 = '\0';
    (*(code *)*_TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_)();
  }
  if (DAT_00725ab0 == '\x01') {
    DAT_00725ab0 = '\0';
    (*(code *)*_TreeEnsembleParameters_TreeNode_default_instance_)();
  }
  if (DAT_00725b08 == '\x01') {
    DAT_00725b08 = '\0';
    (*(code *)*_TreeEnsembleParameters_default_instance_)();
  }
  if (DAT_00725b40 == '\x01') {
    DAT_00725b40 = '\0';
    (*(code *)*_TreeEnsembleClassifier_default_instance_)();
  }
  if (DAT_00725b78 == '\x01') {
    DAT_00725b78 = 0;
    (*(code *)*_TreeEnsembleRegressor_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_.Shutdown();
  _TreeEnsembleParameters_TreeNode_default_instance_.Shutdown();
  _TreeEnsembleParameters_default_instance_.Shutdown();
  _TreeEnsembleClassifier_default_instance_.Shutdown();
  _TreeEnsembleRegressor_default_instance_.Shutdown();
}